

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::encode_truncated_binary(symbol_codec *this,uint v,uint n)

{
  uint num_bits;
  uint uVar1;
  
  num_bits = math::floor_log2i(n);
  uVar1 = (1 << ((byte)(num_bits + 1) & 0x1f)) - n;
  if (uVar1 <= v) {
    v = uVar1 + v;
    num_bits = num_bits + 1;
  }
  encode_bits(this,v,num_bits);
  return;
}

Assistant:

void symbol_codec::encode_truncated_binary(uint v, uint n) {
  CRNLIB_ASSERT((n >= 2) && (v < n));

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  if (v < u)
    encode_bits(v, k);
  else
    encode_bits(v + u, k + 1);
}